

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subcommand.c
# Opt level: O3

REF_STATUS grow(REF_MPI ref_mpi,int argc,char **argv)

{
  char *filename;
  int iVar1;
  uint uVar2;
  uint uVar3;
  size_t sVar4;
  undefined8 uVar5;
  size_t sVar6;
  ulong uVar7;
  char *pcVar8;
  char *message;
  REF_GRID_conflict ref_grid;
  REF_INT pos;
  char project [1000];
  REF_GRID_conflict local_430;
  int local_424;
  undefined8 local_420;
  char local_418 [1000];
  
  local_430 = (REF_GRID)0x0;
  if (ref_mpi->n < 2) {
    if (3 < argc) {
      pcVar8 = argv[2];
      filename = argv[3];
      sVar4 = strlen(pcVar8);
      if (6 < sVar4) {
        sVar6 = 0x3ff;
        if (sVar4 < 0x3ff) {
          sVar6 = sVar4;
        }
        iVar1 = strncmp(pcVar8 + (sVar6 - 6),".meshb",6);
        if (iVar1 == 0) {
          strncpy(local_418,pcVar8,sVar6 - 6);
          local_418[sVar6 - 6] = '\0';
          printf("import %s\n",pcVar8);
          uVar2 = ref_import_by_extension(&local_430,ref_mpi,pcVar8);
          if (uVar2 == 0) {
            uVar3 = ref_args_find(argc,argv,"--mesher",&local_424);
            uVar2 = 6;
            if ((uVar3 != 0) && (uVar3 != 5)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x82e,"grow",(ulong)uVar3,"arg search");
              uVar2 = uVar3;
            }
            if ((uVar3 != 5) && (uVar3 != 0)) {
              return uVar2;
            }
            if (local_424 < argc + -1 && local_424 != -1) {
              local_420 = argv[(long)local_424 + 1];
              if (ref_mpi->id == 0) {
                printf("--mesher %s requested\n");
              }
            }
            else {
              local_420 = "tetgen";
            }
            uVar3 = ref_args_find(argc,argv,"--mesher-options",&local_424);
            if ((uVar3 != 0) && (uVar3 != 5)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0x835,"grow",(ulong)uVar3,"arg search");
              uVar2 = uVar3;
            }
            if ((uVar3 != 5) && (uVar3 != 0)) {
              return uVar2;
            }
            if (local_424 < argc + -1 && local_424 != -1) {
              pcVar8 = argv[(long)local_424 + 1];
              if (ref_mpi->id == 0) {
                printf("--mesher-options %s requested\n",pcVar8);
              }
            }
            else {
              pcVar8 = (char *)0x0;
            }
            if (*local_420 == 'a') {
              message = "aflr volume";
              if (ref_mpi->id == 0) {
                puts("fill volume with AFLR3");
                uVar2 = ref_geom_aflr_volume(local_430,local_418,pcVar8);
                if (uVar2 != 0) {
                  pcVar8 = "aflr surface to volume";
                  uVar5 = 0x849;
LAB_001148a0:
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                         ,uVar5,"grow",(ulong)uVar2,pcVar8);
                  report_interections(local_430,local_418);
                  return uVar2;
                }
              }
            }
            else {
              if (*local_420 != 't') {
                printf("mesher \'%s\' not implemented\n");
                goto LAB_00114548;
              }
              message = "tetgen volume";
              if (ref_mpi->id == 0) {
                puts("fill volume with TetGen");
                uVar2 = ref_geom_tetgen_volume(local_430,local_418,pcVar8);
                if (uVar2 != 0) {
                  pcVar8 = "tetgen surface to volume";
                  uVar5 = 0x841;
                  goto LAB_001148a0;
                }
              }
            }
            ref_mpi_stopwatch_stop(ref_mpi,message);
            local_430->surf = 0;
            uVar2 = ref_validation_boundary_face(local_430);
            if (uVar2 == 0) {
              ref_mpi_stopwatch_stop(local_430->mpi,"boundary-volume check");
              uVar2 = ref_split_edge_geometry(local_430);
              if (uVar2 == 0) {
                ref_mpi_stopwatch_stop(local_430->mpi,"split geom");
                uVar2 = ref_node_synchronize_globals(local_430->node);
                if (uVar2 == 0) {
                  printf("export %s\n",filename);
                  uVar2 = ref_export_by_extension(local_430,filename);
                  if (uVar2 == 0) {
                    uVar2 = ref_validation_cell_volume(local_430);
                    if (uVar2 == 0) {
                      uVar2 = ref_grid_free(local_430);
                      if (uVar2 == 0) {
                        return 0;
                      }
                      pcVar8 = "create";
                      uVar5 = 0x85f;
                    }
                    else {
                      pcVar8 = "vol";
                      uVar5 = 0x85d;
                    }
                  }
                  else {
                    pcVar8 = "vol export";
                    uVar5 = 0x85b;
                  }
                }
                else {
                  pcVar8 = "sync glob";
                  uVar5 = 0x858;
                }
              }
              else {
                pcVar8 = "split geom";
                uVar5 = 0x855;
              }
            }
            else {
              pcVar8 = "boundary-interior connectivity";
              uVar5 = 0x852;
            }
          }
          else {
            pcVar8 = "load surface";
            uVar5 = 0x82c;
          }
          uVar7 = (ulong)uVar2;
          goto LAB_001144ef;
        }
      }
    }
LAB_00114548:
    uVar2 = 1;
    if (ref_mpi->id == 0) {
      grow_help(*argv);
    }
  }
  else {
    pcVar8 = "ref grow is not parallel";
    uVar2 = 6;
    uVar5 = 0x81f;
    uVar7 = 6;
LAB_001144ef:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           uVar5,"grow",uVar7,pcVar8);
  }
  return uVar2;
}

Assistant:

static REF_STATUS grow(REF_MPI ref_mpi, int argc, char *argv[]) {
  char *out_file;
  char *in_file;
  char project[1000];
  size_t end_of_string;
  REF_GRID ref_grid = NULL;
  const char *mesher = "tetgen";
  const char *mesher_options = NULL;
  REF_INT pos;

  if (ref_mpi_para(ref_mpi)) {
    RSS(REF_IMPLEMENT, "ref grow is not parallel");
  }
  if (argc < 4) goto shutdown;
  in_file = argv[2];
  out_file = argv[3];
  end_of_string = MIN(1023, strlen(argv[2]));
  if (7 > end_of_string ||
      strncmp(&(argv[2][end_of_string - 6]), ".meshb", 6) != 0)
    goto shutdown;
  strncpy(project, argv[2], end_of_string - 6);
  project[end_of_string - 6] = '\0';

  printf("import %s\n", in_file);
  RSS(ref_import_by_extension(&ref_grid, ref_mpi, in_file), "load surface");

  RXS(ref_args_find(argc, argv, "--mesher", &pos), REF_NOT_FOUND, "arg search");
  if (REF_EMPTY != pos && pos < argc - 1) {
    mesher = argv[pos + 1];
    if (ref_mpi_once(ref_mpi)) printf("--mesher %s requested\n", mesher);
  }

  RXS(ref_args_find(argc, argv, "--mesher-options", &pos), REF_NOT_FOUND,
      "arg search");
  if (REF_EMPTY != pos && pos < argc - 1) {
    mesher_options = argv[pos + 1];
    if (ref_mpi_once(ref_mpi))
      printf("--mesher-options %s requested\n", mesher_options);
  }

  if (strncmp(mesher, "t", 1) == 0) {
    if (ref_mpi_once(ref_mpi)) {
      printf("fill volume with TetGen\n");
      RSB(ref_geom_tetgen_volume(ref_grid, project, mesher_options),
          "tetgen surface to volume",
          { report_interections(ref_grid, project); });
    }
    ref_mpi_stopwatch_stop(ref_mpi, "tetgen volume");
  } else if (strncmp(mesher, "a", 1) == 0) {
    if (ref_mpi_once(ref_mpi)) {
      printf("fill volume with AFLR3\n");
      RSB(ref_geom_aflr_volume(ref_grid, project, mesher_options),
          "aflr surface to volume",
          { report_interections(ref_grid, project); });
    }
    ref_mpi_stopwatch_stop(ref_mpi, "aflr volume");
  } else {
    printf("mesher '%s' not implemented\n", mesher);
    goto shutdown;
  }

  ref_grid_surf(ref_grid) = REF_FALSE; /* needed until vol mesher para */
  RSS(ref_validation_boundary_face(ref_grid), "boundary-interior connectivity");
  ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "boundary-volume check");

  RSS(ref_split_edge_geometry(ref_grid), "split geom");
  ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "split geom");

  RSS(ref_node_synchronize_globals(ref_grid_node(ref_grid)), "sync glob");

  printf("export %s\n", out_file);
  RSS(ref_export_by_extension(ref_grid, out_file), "vol export");

  RSS(ref_validation_cell_volume(ref_grid), "vol");

  RSS(ref_grid_free(ref_grid), "create");

  return REF_SUCCESS;
shutdown:
  if (ref_mpi_once(ref_mpi)) grow_help(argv[0]);
  return REF_FAILURE;
}